

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

bool __thiscall wasm::Literal::isArithmeticNaN(Literal *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  float f;
  double f_00;
  bool local_2a;
  BasicType local_20 [2];
  Literal *local_18;
  Literal *this_local;
  
  local_18 = this;
  bVar1 = isNaN(this);
  if (!bVar1) {
    return false;
  }
  local_20[1] = 4;
  bVar1 = wasm::Type::operator==(&this->type,local_20 + 1);
  if (bVar1) {
    f = getf32(this);
    uVar2 = NaNPayload(f);
    if (0x7fffff < uVar2) {
      return true;
    }
  }
  local_20[0] = f64;
  bVar1 = wasm::Type::operator==(&this->type,local_20);
  local_2a = false;
  if (bVar1) {
    f_00 = getf64(this);
    uVar3 = NaNPayload(f_00);
    local_2a = 0xfffffffffffff < uVar3;
  }
  return local_2a;
}

Assistant:

bool Literal::isArithmeticNaN() {
  if (!isNaN()) {
    return false;
  }
  return (type == Type::f32 && NaNPayload(getf32()) > (1u << 23) - 1) ||
         (type == Type::f64 && NaNPayload(getf64()) > (1ull << 52) - 1);
}